

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

bool chaiscript::AST_Node::get_bool_condition(Boxed_Value *t_bv,Dispatch_State *t_ss)

{
  bool bVar1;
  Dispatch_Engine *this;
  bad_boxed_cast *anon_var_0;
  Dispatch_State *t_ss_local;
  Boxed_Value *t_bv_local;
  
  this = detail::Dispatch_State::operator->(t_ss);
  bVar1 = detail::Dispatch_Engine::boxed_cast<bool>(this,t_bv);
  return bVar1;
}

Assistant:

bool AST_Node::get_bool_condition(const Boxed_Value &t_bv, const chaiscript::detail::Dispatch_State &t_ss) {
      try {
        return t_ss->boxed_cast<bool>(t_bv);
      } catch (const exception::bad_boxed_cast &) {
        throw exception::eval_error("Condition not boolean");
      }
  }